

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkRef.hpp
# Opt level: O0

Checked<vk::VkDevice_s_*> vk::refdetails::check<vk::VkDevice_s*>(VkDevice_s *object)

{
  TestError *this;
  char *pcVar1;
  allocator<char> local_65 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  VkDevice_s *local_18;
  VkDevice_s *object_local;
  
  local_18 = object;
  if (object == (VkDevice_s *)0x0) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    pcVar1 = getTypeName<vk::VkDevice_s*>();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar1,local_65);
    std::operator+(&local_38,&local_58," = 0");
    pcVar1 = (char *)std::__cxx11::string::c_str();
    tcu::TestError::TestError
              (this,"Object check() failed",pcVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkRef.hpp"
               ,0x35);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  Checked<vk::VkDevice_s_*>::Checked((Checked<vk::VkDevice_s_*> *)&object_local,object);
  return (Checked<vk::VkDevice_s_*>)object_local;
}

Assistant:

inline Checked<T> check (T object)
{
	if (!object)
		throw tcu::TestError("Object check() failed", (std::string(getTypeName<T>()) + " = 0").c_str(), __FILE__, __LINE__);
	return Checked<T>(object);
}